

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O2

int Pm_QueueFull(PmQueue *q)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  if (q == (PmQueue *)0x0) {
    iVar3 = -0x270b;
  }
  else {
    lVar4 = *(long *)((long)q + 8);
    iVar3 = 0;
    uVar2 = *(uint *)((long)q + 0x20);
    if ((int)*(uint *)((long)q + 0x20) < 1) {
      uVar2 = 0;
    }
    uVar5 = (ulong)uVar2;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      lVar1 = lVar4 * 4;
      lVar4 = lVar4 + 1;
      if (*(int *)(*(long *)((long)q + 0x28) + lVar1) != 0) {
        return 1;
      }
    }
  }
  return iVar3;
}

Assistant:

PMEXPORT int Pm_QueueFull(PmQueue *q)
{
    long tail;
    int i; 
    PmQueueRep *queue = (PmQueueRep *) q;
    /* arg checking */
    if (!queue)
        return pmBadPtr;
    tail = queue->tail;
    /* test to see if there is space in the queue */
    for (i = 0; i < queue->msg_size; i++) {
        if (queue->buffer[tail + i]) {
            return TRUE;
        }
    }
    return FALSE;
}